

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spreadsketch.cpp
# Opt level: O1

void __thiscall
DetectorSS::DetectorSS(DetectorSS *this,int depth,int width,int lgn,int b,int c,int memory)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  int iVar5;
  long lVar6;
  int *piVar7;
  long lVar8;
  uchar **__s;
  uchar *__s_00;
  key_tp **ppkVar9;
  int **ppiVar10;
  key_tp *__s_01;
  unsigned_long *puVar11;
  size_t n;
  uint64_t uVar12;
  uint64_t uVar13;
  ostream *poVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong __n;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  double __x;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined8 in_XMM1_Qa;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  char name [11];
  uchar local_40 [16];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->heap_).
  super__Vector_base<std::pair<unsigned_int,_unsigned_long>,_std::allocator<std::pair<unsigned_int,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->ss_).depth = depth;
  (this->ss_).width = width;
  (this->ss_).lgn = lgn;
  iVar5 = 4;
  if (depth < 4) {
    iVar5 = depth;
  }
  (this->ss_).tdepth = iVar5;
  (this->ss_).b = b;
  (this->ss_).c = c;
  iVar5 = memory - (c + -1) * b;
  if (memory < 1) {
    iVar5 = b * 2;
  }
  (this->ss_).lastb = iVar5;
  if (iVar5 < b * 2) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Not enough memory for last component: b=",0x28);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  c=",4);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,"   mem=",7);
    poVar14 = (ostream *)std::ostream::operator<<(poVar14,memory);
    std::endl<char,std::char_traits<char>>(poVar14);
  }
  else {
    __x = (double)b;
    auVar20._0_8_ = log(__x);
    auVar20._8_56_ = extraout_var;
    auVar22._0_8_ = (double)c;
    auVar22._8_8_ = in_XMM1_Qa;
    auVar23 = vfmadd231sd_fma(auVar20._0_16_,auVar22,ZEXT816(0x3fe62e42fefa39ef));
    if (22.18070977791825 <= auVar23._0_8_) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Multiresolition bitmap too fine for 32 bit hash: b=",0x33);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  c=",4);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,c);
      std::endl<char,std::char_traits<char>>(poVar14);
    }
    else {
      auVar21._0_8_ = log(__x);
      auVar21._8_56_ = extraout_var_00;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = auVar22._0_8_;
      auVar23 = vfmadd231sd_fma(auVar21._0_16_,auVar23,ZEXT816(0x3fe62e42fefa39ef));
      if (auVar23._0_8_ <= 18.714973875118524) {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = __x;
        auVar23 = vfmadd213sd_fma(ZEXT816(0x3fedcb295e9e1b09),auVar24,ZEXT816(0x3fe0000000000000));
        (this->ss_).setmax = (int)auVar23._0_8_;
        lVar6 = (long)c;
        uVar17 = 0xffffffffffffffff;
        if (-2 < c) {
          uVar17 = lVar6 * 4 + 4;
        }
        piVar7 = (int *)operator_new__(uVar17);
        memset(piVar7,0,uVar17);
        (this->ss_).offsets = piVar7;
        if (0 < c) {
          auVar18 = vpbroadcastq_avx512vl();
          auVar19 = vpbroadcastd_avx512vl();
          auVar2 = vpmovsxbq_avx2(ZEXT416(0x7060504));
          auVar3 = vpmovsxbq_avx2(ZEXT416(0x3020100));
          auVar1 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
          lVar8 = 0;
          auVar25._8_8_ = 8;
          auVar25._0_8_ = 8;
          auVar25._16_8_ = 8;
          auVar25._24_8_ = 8;
          auVar26._8_4_ = 8;
          auVar26._0_8_ = 0x800000008;
          auVar26._12_4_ = 8;
          auVar26._16_4_ = 8;
          auVar26._20_4_ = 8;
          auVar26._24_4_ = 8;
          auVar26._28_4_ = 8;
          do {
            vpcmpuq_avx512vl(auVar3,auVar18,2);
            vpcmpuq_avx512vl(auVar2,auVar18,2);
            auVar4 = vpmulld_avx2(auVar1,auVar19);
            auVar4 = vmovdqu32_avx512vl(auVar4);
            *(undefined1 (*) [32])((long)piVar7 + lVar8) = auVar4;
            auVar3 = vpaddq_avx2(auVar3,auVar25);
            auVar2 = vpaddq_avx2(auVar2,auVar25);
            auVar1 = vpaddd_avx2(auVar1,auVar26);
            lVar8 = lVar8 + 0x20;
          } while ((ulong)(c + 7U >> 3) << 5 != lVar8);
        }
        piVar7[lVar6] = (this->ss_).lastb + piVar7[lVar6 + -1];
        iVar5 = (this->ss_).depth;
        lVar8 = (long)iVar5;
        uVar17 = 0xffffffffffffffff;
        if (-1 < lVar8) {
          uVar17 = lVar8 * 8;
        }
        __s = (uchar **)operator_new__(uVar17);
        memset(__s,0,uVar17);
        (this->ss_).counts = __s;
        if (0 < iVar5) {
          iVar5 = (this->ss_).width;
          lVar15 = 0;
          do {
            uVar17 = (long)((this->ss_).offsets[lVar6] + 7 >> 3) * (long)iVar5;
            __s_00 = (uchar *)operator_new__(uVar17);
            memset(__s_00,0,uVar17);
            (this->ss_).counts[lVar15] = __s_00;
            lVar15 = lVar15 + 1;
          } while (lVar8 != lVar15);
        }
        uVar17 = 0xffffffffffffffff;
        if (-1 < depth) {
          uVar17 = (long)depth << 3;
        }
        ppkVar9 = (key_tp **)operator_new__(uVar17);
        (this->ss_).skey = ppkVar9;
        ppiVar10 = (int **)operator_new__(uVar17);
        (this->ss_).level = ppiVar10;
        if (0 < depth) {
          __n = 0xffffffffffffffff;
          if (-1 < width) {
            __n = (long)width << 2;
          }
          uVar16 = 0;
          do {
            __s_01 = (key_tp *)operator_new__(__n);
            memset(__s_01,0,__n);
            (this->ss_).skey[uVar16] = __s_01;
            piVar7 = (int *)operator_new__(__n);
            memset(piVar7,0,__n);
            (this->ss_).level[uVar16] = piVar7;
            uVar16 = uVar16 + 1;
          } while ((uint)depth != uVar16);
        }
        puVar11 = (unsigned_long *)operator_new__(uVar17);
        (this->ss_).hash = puVar11;
        builtin_memcpy(local_40,"DetectorSS",0xb);
        n = strlen((char *)local_40);
        uVar12 = SS_AwareHash(local_40,n,0x30c4becb9,0x35220fe14f,0x18aa1dca9);
        if (0 < depth) {
          uVar17 = 0;
          do {
            uVar13 = SS_GenHashSeed((int)uVar12 + (int)uVar17);
            (this->ss_).hash[uVar17] = uVar13;
            uVar17 = uVar17 + 1;
          } while ((uint)depth != uVar17);
        }
        return;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Unsafe DiscounterMRB for a 32 bit hash: b=",0x2a);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,"  c=",4);
      poVar14 = (ostream *)std::ostream::operator<<(poVar14,c);
      std::endl<char,std::char_traits<char>>(poVar14);
    }
  }
  exit(-1);
}

Assistant:

DetectorSS::DetectorSS(int depth, int width, int lgn, int b, int c, int memory) {
	ss_.depth = depth;
	ss_.width = width;
	ss_.lgn = lgn;
	ss_.tdepth = depth > 4 ? 4 : depth;
	//init bitmap
	ss_.b = b;
	ss_.c = c;
	ss_.lastb = (memory > 0 ? memory - (c - 1) * b : b * 2);
	if (ss_.lastb < b * 2) {
		std::cout << "Not enough memory for last component: b=" << b << "  c=" << c
			<< "   mem=" << memory << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c >= 32 * log(2)) {
		std::cout << "Multiresolition bitmap too fine for 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}
	if (log(b) + log(2) * c > 27 * log(2)) {
		std::cout << "Unsafe DiscounterMRB for a 32 bit hash: b=" << b << "  c="
			<< c << std::endl;
		exit(-1);
	}

	ss_.setmax = (int)(b * bitsetratio + 0.5);
	ss_.offsets = new int[c + 1]();
	for (int i = 0; i < c; i++) { ss_.offsets[i] = i * b; }
	ss_.offsets[c] = ss_.offsets[c - 1] + ss_.lastb;
	ss_.counts = new unsigned char* [ss_.depth]();
	for (int i = 0; i < ss_.depth; i++) {
		int size = (ss_.offsets[c] + 7) >> 3;
		ss_.counts[i] = new unsigned char[size * ss_.width]();
	}

	//init SSketch
	ss_.skey = new key_tp * [depth];
	ss_.level = new int* [depth];
	for (int i = 0; i < depth; i++) {
		ss_.skey[i] = new key_tp[width]();
		ss_.level[i] = new int[width]();
	}
	ss_.hash = new unsigned long[depth];
	char name[] = "DetectorSS";
	unsigned long seed = SS_AwareHash((unsigned char*)name, strlen(name), 13091204281, 228204732751, 6620830889);
	for (int i = 0; i < depth; i++) {
		ss_.hash[i] = SS_GenHashSeed(seed++);
	}
}